

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::setDate(QDateTimeEdit *this,QDate date)

{
  QDate date_00;
  long in_FS_OFFSET;
  QDateTime when;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (date.jd + 0xb69eeff91fU < 0x16d3e147974) {
    date_00.jd = *(qint64 *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
    if ((*(byte *)(date_00.jd + 0x471) & 7) == 0) {
      setDateRange(this,date,date);
    }
    (**(code **)(*(long *)date_00.jd + 0xf8))(date_00.jd);
    _when = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toTime();
    QDateTimeEditPrivate::dateTimeValue((QDateTimeEditPrivate *)&when,date_00,(QTime)(int)date.jd);
    ::QVariant::QVariant(&local_40,&when);
    QAbstractSpinBoxPrivate::setValue
              ((QAbstractSpinBoxPrivate *)date_00.jd,&local_40,EmitIfChanged,true);
    ::QVariant::~QVariant(&local_40);
    QDateTimeEditPrivate::updateTimeZone((QDateTimeEditPrivate *)date_00.jd);
    QDateTime::~QDateTime(&when);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setDate(QDate date)
{
    Q_D(QDateTimeEdit);
    if (date.isValid()) {
        if (!(d->sections & DateSections_Mask))
            setDateRange(date, date);

        d->clearCache();
        QDateTime when = d->dateTimeValue(date, d->value.toTime());
        Q_ASSERT(when.isValid());
        d->setValue(when, EmitIfChanged);
        d->updateTimeZone();
    }
}